

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

void __thiscall
IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
          (ByteCodeUsesInstr *this,bool isJITOptimizedReg,uint symId)

{
  JitArenaAllocator *pJVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,isJITOptimizedReg) == 0) {
    this_00 = this->byteCodeUpwardExposedUsed;
    if (this_00 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      this_00 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,((this->super_Instr).m_func)->m_alloc,0x3eba5c);
      pJVar1 = ((this->super_Instr).m_func)->m_alloc;
      this_00->head = (Type_conflict)0x0;
      this_00->lastFoundIndex = (Type_conflict)0x0;
      this_00->alloc = pJVar1;
      this_00->lastUsedNodePrevNextField = (Type)this_00;
      this->byteCodeUpwardExposedUsed = this_00;
    }
    BVSparse<Memory::JitArenaAllocator>::Set(this_00,symId);
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar4 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                     ,0x3af,"(false)",
                     "Tried to add a jit-optimized register to a ByteCodeUses instruction!");
  if (bVar3) {
    *puVar4 = 0;
    return;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void ByteCodeUsesInstr::SetRemovedOpndSymbol(bool isJITOptimizedReg, uint symId)
{
    if (isJITOptimizedReg)
    {
        AssertMsg(false, "Tried to add a jit-optimized register to a ByteCodeUses instruction!");
        // Although we assert on debug builds, we should actually be ok with release builds
        // if we ignore the operand; not ignoring it, however, can cause us to introduce an
        // inconsistency in bytecode register lifetimes.
        return;
    }
    if(!this->byteCodeUpwardExposedUsed)
    {
        this->byteCodeUpwardExposedUsed = JitAnew(m_func->m_alloc, BVSparse<JitArenaAllocator>, m_func->m_alloc);
    }
    this->byteCodeUpwardExposedUsed->Set(symId);
}